

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_variance_sse2.c
# Opt level: O3

uint aom_highbd_8_mse8x8_sse2(uint8_t *src8,int src_stride,uint8_t *ref8,int ref_stride,uint *sse)

{
  uint uVar1;
  undefined8 in_RAX;
  int sum0;
  uint sse0;
  undefined1 auStack_18 [4];
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  *sse = 0;
  aom_highbd_calc8x8var_sse2
            ((long)src8 * 2,src_stride,(long)ref8 * 2,ref_stride,&local_14,auStack_18);
  uVar1 = *sse;
  *sse = uVar1 + local_14;
  return uVar1 + local_14;
}

Assistant:

unsigned int aom_highbd_8_mse8x8_sse2(const uint8_t *src8, int src_stride,
                                      const uint8_t *ref8, int ref_stride,
                                      unsigned int *sse) {
  int sum;
  uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  uint16_t *ref = CONVERT_TO_SHORTPTR(ref8);
  highbd_8_variance_sse2(src, src_stride, ref, ref_stride, 8, 8, sse, &sum,
                         aom_highbd_calc8x8var_sse2, 8);
  return *sse;
}